

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnusedSensitiveSignal.cpp
# Opt level: O1

void __thiscall
unused_sensitive_signal::MainVisitor::handle(MainVisitor *this,ProceduralBlockSymbol *block)

{
  size_t __n;
  char *__s1;
  SourceLocation location;
  long lVar1;
  pointer ppVar2;
  pointer ppVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Statement *pSVar7;
  ulong uVar8;
  Diagnostic *this_00;
  size_type __rlen;
  string_view *psVar9;
  string_view sVar10;
  CollectAllIdentifiers timingIdVisitor;
  CollectAllIdentifiers stmtIdVisitor;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
  unusedSignals;
  CollectAllIdentifiers local_d8;
  CollectAllIdentifiers local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  long local_90;
  long local_88 [2];
  string_view *local_78;
  string_view *psStack_70;
  long local_68;
  string_view *local_60;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  
  sVar10 = slang::SourceManager::getFileName(*(SourceManager **)this,(block->super_Symbol).location)
  ;
  bVar4 = TidyVisitor::skip((TidyVisitor *)this,sVar10);
  if ((!bVar4) && ((block->procedureKind == AlwaysFF || (block->procedureKind == Always)))) {
    pSVar7 = slang::ast::ProceduralBlockSymbol::getBody(block);
    if (pSVar7->kind == Timed) {
      pSVar7 = slang::ast::ProceduralBlockSymbol::getBody(block);
      if (((pSVar7[1].syntax)->super_SyntaxNode).kind == SeparatedList) {
        local_b8.identifiers.
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.identifiers.
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.identifiers.
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d8.identifiers.
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d8.identifiers.
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.identifiers.
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pSVar7 = slang::ast::ProceduralBlockSymbol::getBody(block);
        slang::ast::Statement::visit<unused_sensitive_signal::MainVisitor::CollectAllIdentifiers&>
                  ((Statement *)
                   ((pSVar7[1].syntax)->attributes).super_SyntaxListBase._vptr_SyntaxListBase,
                   &local_b8);
        pSVar7 = slang::ast::ProceduralBlockSymbol::getBody(block);
        slang::ast::TimingControl::
        visit<unused_sensitive_signal::MainVisitor::CollectAllIdentifiers>
                  (*(TimingControl **)(pSVar7 + 1),&local_d8);
        ppVar3 = local_d8.identifiers.
                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar2 = local_d8.identifiers.
                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_d8.identifiers.
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_d8.identifiers.
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          uVar8 = ((long)local_d8.identifiers.
                         super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_d8.identifiers.
                         super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          lVar1 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<unused_sensitive_signal::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (local_d8.identifiers.
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_d8.identifiers.
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,__gnu_cxx::__ops::_Iter_comp_iter<unused_sensitive_signal::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (ppVar2,ppVar3);
        }
        ppVar3 = local_b8.identifiers.
                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar2 = local_b8.identifiers.
                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_b8.identifiers.
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_b8.identifiers.
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          uVar8 = ((long)local_b8.identifiers.
                         super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_b8.identifiers.
                         super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          lVar1 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<unused_sensitive_signal::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (local_b8.identifiers.
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_b8.identifiers.
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,__gnu_cxx::__ops::_Iter_comp_iter<unused_sensitive_signal::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (ppVar2,ppVar3);
        }
        local_78 = (string_view *)0x0;
        psStack_70 = (string_view *)0x0;
        local_68 = 0;
        std::
        __set_difference<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,std::back_insert_iterator<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,__gnu_cxx::__ops::_Iter_comp_iter<unused_sensitive_signal::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (local_d8.identifiers.
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_d8.identifiers.
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_b8.identifiers.
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_b8.identifiers.
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        local_60 = psStack_70;
        psVar9 = local_78;
        if (local_78 != psStack_70) {
          do {
            __n = psVar9->_M_len;
            __s1 = psVar9->_M_str;
            sVar10 = *psVar9;
            location = (SourceLocation)psVar9[1]._M_len;
            if (__n == (*(undefined8 **)(this + 0x10))[1]) {
              if (__n == 0) {
                bVar4 = true;
              }
              else {
                iVar6 = bcmp(__s1,(void *)**(undefined8 **)(this + 0x10),__n);
                bVar4 = iVar6 == 0;
              }
            }
            else {
              bVar4 = false;
            }
            if (bVar4) {
              bVar5 = false;
            }
            else {
              local_98._M_current = (char *)local_88;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,__s1,__s1 + __n);
              local_58.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_58._M_begin._M_current = (char *)0x0;
              local_58.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_58.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              bVar5 = std::__detail::
                      __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                (local_98,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           )(local_98._M_current + local_90),&local_58,
                                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                                 (*(long *)(this + 0x10) + 0x40),0);
              if (local_58.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_58.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_58.
                                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_58.
                                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              bVar5 = !bVar5;
            }
            if ((!bVar4) && ((long *)local_98._M_current != local_88)) {
              operator_delete(local_98._M_current,local_88[0] + 1);
            }
            if (bVar5) {
              this_00 = slang::Diagnostics::add
                                  (*(Diagnostics **)(this + 8),(DiagCode)0x120010,location);
              slang::Diagnostic::operator<<(this_00,sVar10);
            }
            psVar9 = (string_view *)&psVar9[1]._M_str;
          } while (psVar9 != local_60);
        }
        if (local_78 != (string_view *)0x0) {
          operator_delete(local_78,local_68 - (long)local_78);
        }
        if (local_d8.identifiers.
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.identifiers.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.identifiers.
                                super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.identifiers.
                                super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.identifiers.
            super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.identifiers.
                          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.identifiers.
                                super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.identifiers.
                                super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
  }
  return;
}

Assistant:

void handle(const ProceduralBlockSymbol& block) {
        NEEDS_SKIP_SYMBOL(block)

        if (block.procedureKind != ProceduralBlockKind::AlwaysFF &&
            block.procedureKind != ProceduralBlockKind::Always)
            return;

        if (block.getBody().kind != StatementKind::Timed ||
            block.getBody().as<TimedStatement>().stmt.kind != StatementKind::Block)
            return;

        CollectAllIdentifiers stmtIdVisitor, timingIdVisitor;
        block.getBody().as<TimedStatement>().stmt.as<BlockStatement>().visitStmts(stmtIdVisitor);
        block.getBody().as<TimedStatement>().timing.visit(timingIdVisitor);

        auto compare = [](const auto& a, const auto& b) { return a.first < b.first; };

        std::sort(timingIdVisitor.identifiers.begin(), timingIdVisitor.identifiers.end(), compare);
        std::sort(stmtIdVisitor.identifiers.begin(), stmtIdVisitor.identifiers.end(), compare);

        std::vector<std::pair<std::string_view, SourceLocation>> unusedSignals;

        std::set_difference(timingIdVisitor.identifiers.begin(), timingIdVisitor.identifiers.end(),
                            stmtIdVisitor.identifiers.begin(), stmtIdVisitor.identifiers.end(),
                            std::back_inserter(unusedSignals), compare);

        for (auto signal : unusedSignals) {
            // either match against clkName or against the regex pattern
            if (signal.first != config.getCheckConfigs().clkName &&
                !(std::regex_match(std::string(signal.first),
                                   config.getCheckConfigs().clkNameRegexPattern)))
                diags.add(diag::UnusedSensitiveSignal, signal.second) << signal.first;
        }
    }